

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,string *keyword,cmExpandedCommandArgument *argument)

{
  PolicyStatus PVar1;
  size_t __n;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  PolicyID id;
  bool bVar5;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  PVar1 = this->Policy54Status;
  if (((PVar1 < NEW) || (argument->Quoted == false)) &&
     (__n = (argument->Value)._M_string_length, __n == keyword->_M_string_length)) {
    if (__n != 0) {
      iVar3 = bcmp((argument->Value)._M_dataplus._M_p,(keyword->_M_dataplus)._M_p,__n);
      if (iVar3 != 0) goto LAB_00318fe2;
    }
    bVar5 = true;
    if ((PVar1 == WARN) && (argument->Quoted != false)) {
      bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x36,id);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,
                            local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Quoted keywords like \"",0x16);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(argument->Value)._M_dataplus._M_p,
                            (argument->Value)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                   ,0x86);
        this_00 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      }
    }
  }
  else {
LAB_00318fe2:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(std::string const& keyword,
  cmExpandedCommandArgument& argument) const
{
  if((this->Policy54Status != cmPolicies::WARN &&
     this->Policy54Status != cmPolicies::OLD) &&
     argument.WasQuoted())
    {
    return false;
    }

  bool isKeyword = argument.GetValue() == keyword;

  if(isKeyword && argument.WasQuoted() &&
    this->Policy54Status == cmPolicies::WARN)
    {
    if(!this->Makefile.HasCMP0054AlreadyBeenReported())
      {
      std::ostringstream e;
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054) << "\n";
      e << "Quoted keywords like \"" << argument.GetValue() <<
        "\" will no longer be interpreted as keywords "
        "when the policy is set to NEW.  "
        "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
    }

  return isKeyword;
}